

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O0

void __thiscall NaParams::ListOfParamsToLog(NaParams *this)

{
  long in_RDI;
  int i;
  int local_c;
  
  NaPrintLog("----------------------------->8----------------------------\n");
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x418); local_c = local_c + 1) {
    NaPrintLog("%s=%s\n",*(undefined8 *)(*(long *)(in_RDI + 0x410) + (long)local_c * 0x10),
               *(undefined8 *)(*(long *)(in_RDI + 0x410) + (long)local_c * 0x10 + 8));
  }
  NaPrintLog("-----------------------------8<----------------------------\n");
  return;
}

Assistant:

void
NaParams::ListOfParamsToLog () const
{
  int	i;
  NaPrintLog("----------------------------->8----------------------------\n");
  for(i = 0; i < stored_n; ++i)
    NaPrintLog("%s=%s\n", storage[i].name, storage[i].value);
  NaPrintLog("-----------------------------8<----------------------------\n");
}